

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int lre_is_space(int c)

{
  int high;
  int low;
  int n;
  int i;
  int c_local;
  
  i = 0;
  while( true ) {
    if (9 < i) {
      return 0;
    }
    if (c < (int)(uint)char_range_s[i * 2 + 1]) break;
    if (c < (int)(uint)char_range_s[i * 2 + 2]) {
      return 1;
    }
    i = i + 1;
  }
  return 0;
}

Assistant:

BOOL lre_is_space(int c)
{
    int i, n, low, high;
    n = (countof(char_range_s) - 1) / 2;
    for(i = 0; i < n; i++) {
        low = char_range_s[2 * i + 1];
        if (c < low)
            return FALSE;
        high = char_range_s[2 * i + 2];
        if (c < high)
            return TRUE;
    }
    return FALSE;
}